

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall dlib::text_field::set_text_color(text_field *this,rgb_pixel color)

{
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = (this->super_drawable).m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  (this->text_color_).blue = color.blue;
  (this->text_color_).red = (char)color._0_2_;
  (this->text_color_).green = (char)((ushort)color._0_2_ >> 8);
  base_window::invalidate_rectangle
            (&((this->super_drawable).parent)->super_base_window,&(this->super_drawable).rect);
  auto_mutex::unlock(&local_28);
  return;
}

Assistant:

void text_field::
    set_text_color (
        const rgb_pixel color
    )
    {
        auto_mutex M(m);
        text_color_ = color;
        parent.invalidate_rectangle(rect);
    }